

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector,_void>::visit
          (Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector,_void> *this,Expression *curr)

{
  optional<wasm::Type> labelType;
  optional<wasm::Type> labelType_00;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<unsigned_long> arity;
  optional<wasm::HeapType> ht;
  optional<wasm::HeapType> ht_00;
  optional<wasm::HeapType> ht_01;
  optional<wasm::HeapType> ht_02;
  optional<wasm::HeapType> ht_03;
  optional<wasm::HeapType> ht_04;
  optional<wasm::HeapType> ht_05;
  optional<wasm::HeapType> dest;
  optional<wasm::HeapType> ht_06;
  optional<wasm::HeapType> ht_07;
  optional<wasm::HeapType> ht_08;
  optional<wasm::HeapType> ht_09;
  optional<wasm::HeapType> src;
  optional<wasm::HeapType> ct;
  optional<wasm::HeapType> ct_00;
  optional<wasm::HeapType> ct_01;
  optional<wasm::HeapType> src_00;
  optional<wasm::HeapType> dest_00;
  optional<wasm::HeapType> local_240;
  optional<wasm::HeapType> local_228;
  optional<wasm::HeapType> local_210;
  optional<wasm::HeapType> local_1f8;
  optional<wasm::HeapType> local_1e0;
  optional<wasm::HeapType> local_1c8;
  optional<wasm::HeapType> local_1b0;
  optional<wasm::HeapType> local_198;
  optional<wasm::HeapType> local_180;
  optional<wasm::HeapType> local_168;
  optional<wasm::HeapType> local_150;
  optional<wasm::HeapType> local_138;
  optional<wasm::HeapType> local_120;
  optional<wasm::HeapType> local_108;
  optional<wasm::HeapType> local_f0;
  optional<wasm::HeapType> local_d8;
  optional<wasm::HeapType> local_c0;
  optional<wasm::HeapType> local_a8;
  optional<unsigned_long> local_90;
  optional<unsigned_int> local_7c;
  optional<wasm::Type> local_70;
  optional<wasm::Type> local_58;
  optional<wasm::Type> local_40;
  optional<wasm::Type> local_28;
  Expression *local_18;
  Expression *curr_local;
  Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector,_void> *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBlock
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Block *)curr
                );
      break;
    case IfId:
      IRBuilder::ChildPopper::ConstraintCollector::visitIf((ConstraintCollector *)this,(If *)curr);
      break;
    case LoopId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLoop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Loop *)curr)
      ;
      break;
    case BreakId:
      std::optional<wasm::Type>::optional(&local_28);
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_28.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_28.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBreak
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Break *)curr
                 ,labelType);
      break;
    case SwitchId:
      std::optional<wasm::Type>::optional(&local_40);
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      labelType_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_40.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSwitch
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Switch *)curr,labelType_00);
      break;
    case CallId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCall
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Call *)curr)
      ;
      break;
    case CallIndirectId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallIndirect
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (CallIndirect *)curr);
      break;
    case LocalGetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLocalGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (LocalGet *)curr);
      break;
    case LocalSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLocalSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (LocalSet *)curr);
      break;
    case GlobalGetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitGlobalGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (GlobalGet *)curr);
      break;
    case GlobalSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitGlobalSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (GlobalSet *)curr);
      break;
    case LoadId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitLoad
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Load *)curr)
      ;
      break;
    case StoreId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStore
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Store *)curr
                );
      break;
    case ConstId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitConst
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Const *)curr
                );
      break;
    case UnaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitUnary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Unary *)curr
                );
      break;
    case BinaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBinary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Binary *)curr);
      break;
    case SelectId:
      std::optional<wasm::Type>::optional(&local_70);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_70.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSelect
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Select *)curr,type_00);
      break;
    case DropId:
      std::optional<unsigned_int>::optional(&local_7c);
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDrop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Drop *)curr,
                 local_7c);
      break;
    case ReturnId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitReturn
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Return *)curr);
      break;
    case MemorySizeId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemorySize
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemorySize *)curr);
      break;
    case MemoryGrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryGrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryGrow *)curr);
      break;
    case NopId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitNop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Nop *)curr);
      break;
    case UnreachableId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitUnreachable
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Unreachable *)curr);
      break;
    case AtomicRMWId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicRMW
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      std::optional<wasm::Type>::optional(&local_58);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_58.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicCmpxchg
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicCmpxchg *)curr,type);
      break;
    case AtomicWaitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicWait
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicNotify
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitAtomicFence
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (AtomicFence *)curr);
      break;
    case SIMDExtractId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDExtract
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDReplace
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDShuffle
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDTernary
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDShift
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDShift *)curr);
      break;
    case SIMDLoadId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDLoad
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDLoadStoreLane
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryInit
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryInit *)curr);
      break;
    case DataDropId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDataDrop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (DataDrop *)curr);
      break;
    case MemoryCopyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryCopy *)curr);
      break;
    case MemoryFillId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitMemoryFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (MemoryFill *)curr);
      break;
    case PopId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitPop
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Pop *)curr);
      break;
    case RefNullId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefNull
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefNull *)curr);
      break;
    case RefIsNullId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefIsNull
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefIsNull *)curr);
      break;
    case RefFuncId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefFunc
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefFunc *)curr);
      break;
    case RefEqId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefEq
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(RefEq *)curr
                );
      break;
    case TableGetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableGet *)curr);
      break;
    case TableSetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableSet *)curr);
      break;
    case TableSizeId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableSize
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableSize *)curr);
      break;
    case TableGrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableGrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableGrow *)curr);
      break;
    case TableFillId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableFill *)curr);
      break;
    case TableCopyId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableCopy *)curr);
      break;
    case TableInitId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableInit
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TableInit *)curr);
      break;
    case TryId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTry
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Try *)curr);
      break;
    case TryTableId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTryTable
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TryTable *)curr);
      break;
    case ThrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitThrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(Throw *)curr
                );
      break;
    case RethrowId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRethrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Rethrow *)curr);
      break;
    case ThrowRefId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitThrowRef
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ThrowRef *)curr);
      break;
    case TupleMakeId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleMake
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TupleMake *)curr);
      break;
    case TupleExtractId:
      std::optional<unsigned_long>::optional(&local_90);
      arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = 0;
      arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           local_90.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged =
           local_90.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleExtract
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (TupleExtract *)curr,arity);
      break;
    case RefI31Id:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefI31
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefI31 *)curr);
      break;
    case I31GetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitI31Get
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (I31Get *)curr);
      break;
    case CallRefId:
      std::optional<wasm::HeapType>::optional(&local_a8);
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_a8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_a8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (CallRef *)curr,ht);
      break;
    case RefTestId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefTest
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefTest *)curr);
      break;
    case RefCastId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefCast
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (RefCast *)curr);
      break;
    case BrOnId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBrOn
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(BrOn *)curr)
      ;
      break;
    case StructNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructNew *)curr);
      break;
    case StructGetId:
      std::optional<wasm::HeapType>::optional(&local_c0);
      ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_c0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_c0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructGet *)curr,ht_00);
      break;
    case StructSetId:
      std::optional<wasm::HeapType>::optional(&local_d8);
      ht_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_d8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_d8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructSet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructSet *)curr,ht_01);
      break;
    case StructRMWId:
      std::optional<wasm::HeapType>::optional(&local_f0);
      ht_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_f0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_f0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructRMW
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructRMW *)curr,ht_02);
      break;
    case StructCmpxchgId:
      std::optional<wasm::HeapType>::optional(&local_108);
      ht_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_108.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructCmpxchg
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StructCmpxchg *)curr,ht_03);
      break;
    case ArrayNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewData
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewElem
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayNewFixed
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      std::optional<wasm::HeapType>::optional(&local_120);
      ht_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_120.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayGet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayGet *)curr,ht_04);
      break;
    case ArraySetId:
      std::optional<wasm::HeapType>::optional(&local_138);
      ht_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_138.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArraySet
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArraySet *)curr,ht_05);
      break;
    case ArrayLenId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayLen
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayLen *)curr);
      break;
    case ArrayCopyId:
      std::optional<wasm::HeapType>::optional(&local_150);
      std::optional<wasm::HeapType>::optional(&local_168);
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_150.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      src_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      src_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_168.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      src_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_168.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayCopy
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayCopy *)curr,dest,src_00);
      break;
    case ArrayFillId:
      std::optional<wasm::HeapType>::optional(&local_180);
      ht_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_180.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_180.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayFill
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayFill *)curr,ht_06);
      break;
    case ArrayInitDataId:
      std::optional<wasm::HeapType>::optional(&local_198);
      ht_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_198.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_198.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitData
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayInitData *)curr,ht_07);
      break;
    case ArrayInitElemId:
      std::optional<wasm::HeapType>::optional(&local_1b0);
      ht_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_1b0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_1b0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitElem
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ArrayInitElem *)curr,ht_08);
      break;
    case RefAsId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefAs
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,(RefAs *)curr
                );
      break;
    case StringNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringNew *)curr);
      break;
    case StringConstId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringConst
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringConst *)curr);
      break;
    case StringMeasureId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringMeasure
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringMeasure *)curr);
      break;
    case StringEncodeId:
      std::optional<wasm::HeapType>::optional(&local_1c8);
      ht_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ht_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_1c8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ht_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_1c8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringEncode
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringEncode *)curr,ht_09);
      break;
    case StringConcatId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringConcat
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringConcat *)curr);
      break;
    case StringEqId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringEq
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringEq *)curr);
      break;
    case StringWTF16GetId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringWTF16Get
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStringSliceWTF
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StringSliceWTF *)curr);
      break;
    case ContNewId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContNew
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ContNew *)curr);
      break;
    case ContBindId:
      std::optional<wasm::HeapType>::optional(&local_1e0);
      std::optional<wasm::HeapType>::optional(&local_1f8);
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_1e0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_1e0.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      dest_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      dest_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_1f8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      dest_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_1f8.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ContBind *)curr,src,dest_00);
      break;
    case SuspendId:
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSuspend
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Suspend *)curr);
      break;
    case ResumeId:
      std::optional<wasm::HeapType>::optional(&local_210);
      ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_210.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_210.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResume
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (Resume *)curr,ct);
      break;
    case ResumeThrowId:
      std::optional<wasm::HeapType>::optional(&local_228);
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_228.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_228.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (ResumeThrow *)curr,ct_00);
      break;
    case StackSwitchId:
      std::optional<wasm::HeapType>::optional(&local_240);
      ct_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
      ct_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload =
           local_240.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_payload;
      ct_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged =
           local_240.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::HeapType>._M_engaged;
      ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
                ((ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *)this,
                 (StackSwitch *)curr,ct_01);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visit(Expression *) [SubType = wasm::IRBuilder::ChildPopper::ConstraintCollector, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }